

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

void Amap_ManPrintCuts(Amap_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  
  printf("NODE %5d : Type = ",(ulong)(*(uint *)pNode >> 3));
  uVar1 = (*(uint *)pNode & 7) - 4;
  if (uVar1 < 3) {
    printf(&DAT_006e4dc4 + *(int *)(&DAT_006e4dc4 + (ulong)uVar1 * 4));
  }
  printf("  Cuts = %d\n",(ulong)(*(uint *)&pNode->field_0x8 >> 0xc));
  puVar5 = (uint *)(pNode->field_11).pData;
  for (uVar1 = 0; uVar1 < *(uint *)&pNode->field_0x8 >> 0xc; uVar1 = uVar1 + 1) {
    printf("%3d :  Mat= %3d  Inv=%d  ",(ulong)uVar1,(ulong)(*puVar5 & 0xffff),
           (ulong)(*puVar5 >> 0x10 & 1));
    for (uVar4 = 0; uVar4 < *puVar5 >> 0x11; uVar4 = uVar4 + 1) {
      uVar2 = Abc_Lit2Var(puVar5[uVar4 + 1]);
      iVar3 = Abc_LitIsCompl(puVar5[uVar4 + 1]);
      printf("%d%c ",(ulong)uVar2,(ulong)(iVar3 * 2 + 0x2b));
    }
    putchar(10);
    puVar5 = puVar5 + (ulong)(*puVar5 >> 0x11) + 1;
  }
  return;
}

Assistant:

void Amap_ManPrintCuts( Amap_Obj_t * pNode )
{
    Amap_Cut_t * pCut;
    int c, i;
    printf( "NODE %5d : Type = ", pNode->Id );
    if ( pNode->Type == AMAP_OBJ_AND )
        printf( "AND" );
    else if ( pNode->Type == AMAP_OBJ_XOR )
        printf( "XOR" );
    else if ( pNode->Type == AMAP_OBJ_MUX )
        printf( "MUX" );
    printf( "  Cuts = %d\n", pNode->nCuts );
    Amap_NodeForEachCut( pNode, pCut, c )
    {
        printf( "%3d :  Mat= %3d  Inv=%d  ", c, pCut->iMat, pCut->fInv );
        for ( i = 0; i < (int)pCut->nFans; i++ )
            printf( "%d%c ", Abc_Lit2Var(pCut->Fans[i]), Abc_LitIsCompl(pCut->Fans[i])?'-':'+' );
        printf( "\n" );
    }
}